

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_storage_info.cpp
# Opt level: O2

void duckdb::PragmaStorageInfo::RegisterFunction(BuiltinFunctions *set)

{
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_212;
  allocator local_211;
  LogicalType local_210;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1f8;
  string local_1e0;
  TableFunction local_1c0;
  
  ::std::__cxx11::string::string((string *)&local_1e0,"pragma_storage_info",&local_211);
  LogicalType::LogicalType(&local_210,VARCHAR);
  __l._M_len = 1;
  __l._M_array = &local_210;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_1f8,__l,&local_212);
  TableFunction::TableFunction
            (&local_1c0,&local_1e0,(vector<duckdb::LogicalType,_true> *)&local_1f8,
             PragmaStorageInfoFunction,PragmaStorageInfoBind,PragmaStorageInfoInit,
             (table_function_init_local_t)0x0);
  BuiltinFunctions::AddFunction(set,&local_1c0);
  TableFunction::~TableFunction(&local_1c0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1f8);
  LogicalType::~LogicalType(&local_210);
  ::std::__cxx11::string::~string((string *)&local_1e0);
  return;
}

Assistant:

void PragmaStorageInfo::RegisterFunction(BuiltinFunctions &set) {
	set.AddFunction(TableFunction("pragma_storage_info", {LogicalType::VARCHAR}, PragmaStorageInfoFunction,
	                              PragmaStorageInfoBind, PragmaStorageInfoInit));
}